

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

void __thiscall ot::commissioner::JsonException::JsonException(JsonException *this,Error *aError)

{
  std::invalid_argument::invalid_argument(&this->super_invalid_argument,(string *)&aError->mMessage)
  ;
  *(undefined ***)this = &PTR__JsonException_002895d8;
  Error::Error(&this->mError,aError);
  return;
}

Assistant:

explicit JsonException(Error aError)
        : std::invalid_argument(aError.GetMessage())
        , mError(aError)
    {
    }